

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaWriterFinish(PmaWriter *p,i64 *piEof)

{
  int iVar1;
  long *in_RSI;
  int *in_RDI;
  int rc;
  sqlite3_file *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if (((*in_RDI == 0) && (*(long *)(in_RDI + 2) != 0)) && (in_RDI[5] < in_RDI[6])) {
    iVar1 = sqlite3OsWrite(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),
                           CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    *in_RDI = iVar1;
  }
  *in_RSI = *(long *)(in_RDI + 8) + (long)in_RDI[6];
  sqlite3_free((void *)0x177fd2);
  iVar1 = *in_RDI;
  memset(in_RDI,0,0x30);
  return iVar1;
}

Assistant:

static int vdbePmaWriterFinish(PmaWriter *p, i64 *piEof){
  int rc;
  if( p->eFWErr==0 && ALWAYS(p->aBuffer) && p->iBufEnd>p->iBufStart ){
    p->eFWErr = sqlite3OsWrite(p->pFd, 
        &p->aBuffer[p->iBufStart], p->iBufEnd - p->iBufStart, 
        p->iWriteOff + p->iBufStart
    );
  }
  *piEof = (p->iWriteOff + p->iBufEnd);
  sqlite3_free(p->aBuffer);
  rc = p->eFWErr;
  memset(p, 0, sizeof(PmaWriter));
  return rc;
}